

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_rules.hpp
# Opt level: O0

void ovf::detail::parse::v2::ovf_segment_data_action<ovf::detail::parse::v2::bytes_bin_4>::
     apply<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>,double>
               (action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *in,ovf_file *f,ovf_segment *segment,double *data)

{
  float fVar1;
  long lVar2;
  float value;
  uint32_t ivalue;
  int idx;
  uint8_t *bytes;
  string bytes_str;
  double *data_local;
  ovf_segment *segment_local;
  ovf_file *f_local;
  action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_local;
  
  bytes_str.field_2._8_8_ = data;
  tao::pegtl::internal::
  action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string((string *)&bytes,in);
  lVar2 = std::__cxx11::string::c_str();
  for (value = 0.0; (int)value < f->_state->max_data_index; value = (float)((int)value + 1)) {
    fVar1 = (float)endian::from_little_32((uint8_t *)(lVar2 + ((int)value << 2)));
    if ((int)value < f->_state->max_data_index) {
      *(double *)(bytes_str.field_2._8_8_ + (long)(int)value * 8) = (double)fVar1;
      f->_state->current_column = f->_state->current_column + 1;
    }
    if (segment->valuedim < f->_state->current_column) {
      f->_state->current_column = 0;
      f->_state->current_line = f->_state->current_line + 1;
    }
  }
  f->_state->current_line = 0;
  f->_state->current_column = 0;
  std::__cxx11::string::~string((string *)&bytes);
  return;
}

Assistant:

static void apply( const Input& in, ovf_file & f, const ovf_segment & segment, scalar * data )
            {
                std::string bytes_str = in.string();
                const uint8_t * bytes = reinterpret_cast<const uint8_t *>( bytes_str.c_str() );
                for( int idx=0; idx < f._state->max_data_index; ++idx )
                {
                    uint32_t ivalue = endian::from_little_32( &bytes[4*idx] );
                    float value = *reinterpret_cast<const float *>( &ivalue );

                    if( idx < f._state->max_data_index )
                    {
                        data[idx] = value;
                        ++f._state->current_column;
                    }

                    if( f._state->current_column > segment.valuedim )
                    {
                        f._state->current_column = 0;
                        ++f._state->current_line;
                    }
                }
                f._state->current_line = 0;
                f._state->current_column = 0;
            }